

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_atof.h
# Opt level: O0

int Assimp::strtol10(char *in,char **out)

{
  char cVar1;
  uint local_20;
  int value;
  bool inv;
  char **out_local;
  char *in_local;
  
  cVar1 = *in;
  if ((cVar1 == '-') || (out_local = (char **)in, *in == '+')) {
    out_local = (char **)(in + 1);
  }
  local_20 = strtoul10((char *)out_local,out);
  if (cVar1 == '-') {
    local_20 = -local_20;
  }
  return local_20;
}

Assistant:

inline
int strtol10( const char* in, const char** out=0) {
    bool inv = (*in=='-');
    if ( inv || *in == '+' ) {
        ++in;
    }

    int value = strtoul10(in,out);
    if (inv) {
        value = -value;
    }
    return value;
}